

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O1

void __thiscall jsonnet::internal::FixParens::visit(FixParens *this,Parens *expr)

{
  long lVar1;
  AST *pAVar2;
  
  if (expr->expr == (AST *)0x0) {
    lVar1 = 0;
  }
  else {
    lVar1 = __dynamic_cast(expr->expr,&AST::typeinfo,&Parens::typeinfo,0);
  }
  if (lVar1 != 0) {
    expr->expr = *(AST **)(lVar1 + 0x80);
    pAVar2 = left_recursive_deep(*(AST **)(lVar1 + 0x80));
    fodder_move_front(&pAVar2->openFodder,(Fodder *)(lVar1 + 0x50));
    fodder_move_front(&expr->closeFodder,(Fodder *)(lVar1 + 0x88));
  }
  CompilerPass::visit((CompilerPass *)this,expr);
  return;
}

Assistant:

void visit(Parens *expr)
    {
        if (auto *body = dynamic_cast<Parens *>(expr->expr)) {
            // Deal with fodder.
            expr->expr = body->expr;
            fodder_move_front(open_fodder(body->expr), body->openFodder);
            fodder_move_front(expr->closeFodder, body->closeFodder);
        }
        FmtPass::visit(expr);
    }